

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mksheet.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  Image atlas;
  vector<Image,_std::allocator<Image>_> images;
  allocator_type local_64;
  value_type local_63;
  undefined1 local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  vector<Image,_std::allocator<Image>_> local_40;
  
  if (argc < 3 && argc != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
    pcVar1 = *argv;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10d158);
    }
    else {
      sVar3 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," in.pic out.png\n",0x10);
    iVar2 = 1;
  }
  else {
    pcVar1 = argv[2];
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_60,argv[1],(allocator<char> *)&local_63);
    LoadSpritesheet(&local_40,(string *)local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_60._4_4_,local_60._0_4_) != &local_50) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_60._4_4_,local_60._0_4_),local_50._M_allocated_capacity + 1)
      ;
    }
    uVar4 = (long)local_40.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_40.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                  super__Vector_impl_data._M_start >> 5;
    uVar5 = uVar4 / 10;
    lVar7 = (long)(local_40.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                   super__Vector_impl_data._M_start)->width_ * 10;
    lVar6 = (long)(int)((uint)(uVar4 != uVar5 * 10) + (int)uVar5) *
            (long)(local_40.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                   super__Vector_impl_data._M_start)->height_;
    local_60._0_4_ = (undefined4)lVar7;
    local_60._4_4_ = (undefined4)lVar6;
    local_63.r = '\0';
    local_63.g = '\0';
    local_63.b = '\0';
    std::vector<color_t,_std::allocator<color_t>_>::vector
              ((vector<color_t,_std::allocator<color_t>_> *)(local_60 + 8),lVar6 * lVar7,&local_63,
               &local_64);
    if (local_40.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_40.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      lVar7 = 0;
      uVar4 = 0;
      do {
        Image::Blit((Image *)local_60,
                    (Image *)((long)&(local_40.super__Vector_base<Image,_std::allocator<Image>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->width_ + lVar7),
                    ((int)uVar4 + (int)((uVar4 & 0xffffffff) / 10) * -10) *
                    *(int *)((long)&(local_40.super__Vector_base<Image,_std::allocator<Image>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->width_ + lVar7),
                    (int)((uVar4 & 0xffffffff) / 10) *
                    *(int *)((long)&(local_40.super__Vector_base<Image,_std::allocator<Image>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->height_ + lVar7));
        uVar4 = uVar4 + 1;
        lVar7 = lVar7 + 0x20;
      } while (uVar4 < (ulong)((long)local_40.super__Vector_base<Image,_std::allocator<Image>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)local_40.super__Vector_base<Image,_std::allocator<Image>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 5));
    }
    stbi_write_png(pcVar1,local_60._0_4_,local_60._4_4_,3,(void *)local_60._8_8_,local_60._0_4_ * 3)
    ;
    if ((pointer)local_60._8_8_ != (pointer)0x0) {
      operator_delete((void *)local_60._8_8_,local_50._8_8_ - local_60._8_8_);
    }
    std::vector<Image,_std::allocator<Image>_>::~vector(&local_40);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int main(int argc, char** argv) {
  if (argc)

    if (argc < 3) {
      std::cerr << "Usage: " << argv[0] << " in.pic out.png\n";
      return 1;
    }

  auto const in_filename = argv[1];
  auto const out_filename = argv[2];

  auto images = LoadSpritesheet(in_filename);

  auto const spritesheet_width = 10;
  auto const spritesheet_height = images.size() % 10 == 0
                                      ? (int)(images.size() / 10)
                                      : (int)(images.size() / 10) + 1;
  auto atlas = Image{images[0].GetWidth() * spritesheet_width,
                     images[0].GetHeight() * spritesheet_height};

  for (auto i = 0; i < images.size(); ++i) {
    auto& image = images[i];
    atlas.Blit(images[i], (i % spritesheet_width) * image.GetWidth(),
               (i / spritesheet_width) * image.GetHeight());
  }

  // XXX: I'm relying on color_t to serialize properly without
  // intervention which may not be the case on non-x86 platforms
  stbi_write_png(out_filename, atlas.GetWidth(), atlas.GetHeight(),
                 kImageComponents, atlas.GetData().data(),
                 atlas.GetWidth() * kImageComponents);

  return 0;
}